

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasn1element.cpp
# Opt level: O3

bool __thiscall QAsn1Element::toBool(QAsn1Element *this,bool *ok)

{
  int iVar1;
  long in_FS_OFFSET;
  bool bVar2;
  bool bVar3;
  QAsn1Element local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  fromBool(&local_50,true);
  if ((this->mType == local_50.mType) && ((this->mValue).d.size == local_50.mValue.d.size)) {
    if (local_50.mValue.d.size == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((this->mValue).d.ptr,local_50.mValue.d.ptr,local_50.mValue.d.size);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (&(local_50.mValue.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.mValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.mValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.mValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_50.mValue.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (bVar2 == false) {
    bVar3 = false;
    fromBool(&local_50,false);
    if (this->mType == local_50.mType) {
      if ((this->mValue).d.size == local_50.mValue.d.size) {
        if (local_50.mValue.d.size == 0) {
          bVar3 = true;
        }
        else {
          iVar1 = bcmp((this->mValue).d.ptr,local_50.mValue.d.ptr,local_50.mValue.d.size);
          bVar3 = iVar1 == 0;
        }
      }
      else {
        bVar3 = false;
      }
    }
    if (&(local_50.mValue.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.mValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.mValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_50.mValue.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_50.mValue.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    bVar3 = true;
  }
  if (ok != (bool *)0x0) {
    *ok = bVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QAsn1Element::toBool(bool *ok) const
{
    if (*this == fromBool(true)) {
        if (ok)
            *ok = true;
        return true;
    } else if (*this == fromBool(false)) {
        if (ok)
            *ok = true;
        return false;
    } else {
        if (ok)
            *ok = false;
        return false;
    }
}